

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O1

int corpus_get_seg(uint16 **seg,int32 *n_seg)

{
  int iVar1;
  char *rel_path;
  
  iVar1 = -1;
  if (requires_seg == '\x01') {
    rel_path = cur_ctl_utt_id;
    if (cur_ctl_utt_id == (char *)0x0) {
      rel_path = cur_ctl_path;
    }
    mk_filename(2,rel_path);
    iVar1 = areadshort(mk_filename::fn,(short **)seg,n_seg);
    iVar1 = iVar1 >> 0x1f;
  }
  return iVar1;
}

Assistant:

int
corpus_get_seg(uint16 **seg,
	       int32 *n_seg)
{
    char *rel_path;

    if (!requires_seg) {
	/* asked for seg data, but not set up to send it */
	return S3_ERROR;
    }

    /* If control file specifies an utt ID, use it.  O/W use the path */
    if (cur_ctl_utt_id != NULL)
	rel_path = cur_ctl_utt_id;
    else
	rel_path = cur_ctl_path;

    if (areadshort(mk_filename(DATA_TYPE_SEG, rel_path), (int16**)seg, n_seg) < 0)
	return S3_ERROR;
    
    return S3_SUCCESS;
}